

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# repair.cc
# Opt level: O0

void __thiscall leveldb::anon_unknown_4::Repairer::ScanTable(Repairer *this,uint64_t number)

{
  Logger *pLVar1;
  undefined8 uVar2;
  bool bVar3;
  bool bVar4;
  uint uVar5;
  int iVar6;
  undefined8 uVar7;
  Iterator *pIVar8;
  undefined4 extraout_var;
  TableInfo local_238;
  Status local_1d8 [4];
  Status local_1b8;
  Status local_1b0;
  leveldb local_1a8 [32];
  undefined1 local_188 [8];
  Slice key;
  ParsedInternalKey parsed;
  bool empty;
  Iterator *iter;
  int counter;
  leveldb local_120 [32];
  leveldb local_100 [32];
  Status local_e0;
  Status local_d8;
  Status s2;
  Status local_b0;
  Status status;
  leveldb local_98 [8];
  string fname;
  undefined1 local_78 [8];
  TableInfo t;
  uint64_t number_local;
  Repairer *this_local;
  
  t.max_sequence = number;
  TableInfo::TableInfo((TableInfo *)local_78);
  t.meta.refs = (undefined4)t.max_sequence;
  t.meta.allowed_seeks = t.max_sequence._4_4_;
  TableFileName(local_98,&this->dbname_,t.max_sequence);
  (*this->env_->_vptr_Env[0xb])(&local_b0,this->env_,local_98,&t.meta.number);
  bVar3 = Status::ok(&local_b0);
  if (!bVar3) {
    SSTTableFileName((leveldb *)&s2,&this->dbname_,t.max_sequence);
    std::__cxx11::string::operator=((string *)local_98,(string *)&s2);
    std::__cxx11::string::~string((string *)&s2);
    (*this->env_->_vptr_Env[0xb])(&local_d8,this->env_,(string *)local_98,&t.meta.number);
    bVar3 = Status::ok(&local_d8);
    if (bVar3) {
      Status::OK();
      Status::operator=(&local_b0,&local_e0);
      Status::~Status(&local_e0);
    }
    Status::~Status(&local_d8);
  }
  bVar3 = Status::ok(&local_b0);
  if (bVar3) {
    iter._0_4_ = 0;
    pIVar8 = NewTableIterator(this,(FileMetaData *)local_78);
    bVar3 = true;
    ParsedInternalKey::ParsedInternalKey((ParsedInternalKey *)&key.size_);
    t.meta.largest._24_8_ = 0;
    (*pIVar8->_vptr_Iterator[3])();
    while (uVar5 = (*pIVar8->_vptr_Iterator[2])(), (uVar5 & 1) != 0) {
      iVar6 = (*pIVar8->_vptr_Iterator[8])();
      local_188 = (undefined1  [8])CONCAT44(extraout_var,iVar6);
      bVar4 = ParseInternalKey((Slice *)local_188,(ParsedInternalKey *)&key.size_);
      uVar2 = t.meta._0_8_;
      if (bVar4) {
        iter._0_4_ = (uint)iter + 1;
        if (bVar3) {
          bVar3 = false;
          InternalKey::DecodeFrom((InternalKey *)&t.meta.file_size,(Slice *)local_188);
        }
        InternalKey::DecodeFrom((InternalKey *)&t.meta.smallest.field_0x18,(Slice *)local_188);
        if ((ulong)t.meta.largest._24_8_ < parsed.user_key.size_) {
          t.meta.largest._24_8_ = parsed.user_key.size_;
        }
      }
      else {
        pLVar1 = (this->options_).info_log;
        EscapeString_abi_cxx11_(local_1a8,(Slice *)local_188);
        uVar7 = std::__cxx11::string::c_str();
        Log(pLVar1,"Table #%llu: unparsable key %s",uVar2,uVar7);
        std::__cxx11::string::~string((string *)local_1a8);
      }
      (*pIVar8->_vptr_Iterator[6])();
    }
    (*pIVar8->_vptr_Iterator[10])(&local_1b0);
    bVar3 = Status::ok(&local_1b0);
    Status::~Status(&local_1b0);
    if (((bVar3 ^ 0xffU) & 1) != 0) {
      (*pIVar8->_vptr_Iterator[10])(&local_1b8);
      Status::operator=(&local_b0,&local_1b8);
      Status::~Status(&local_1b8);
    }
    if (pIVar8 != (Iterator *)0x0) {
      (*pIVar8->_vptr_Iterator[1])();
    }
    uVar2 = t.meta._0_8_;
    pLVar1 = (this->options_).info_log;
    Status::ToString_abi_cxx11_(local_1d8);
    uVar7 = std::__cxx11::string::c_str();
    Log(pLVar1,"Table #%llu: %d entries %s",uVar2,(ulong)(uint)iter,uVar7);
    std::__cxx11::string::~string((string *)local_1d8);
    bVar3 = Status::ok(&local_b0);
    if (bVar3) {
      std::
      vector<leveldb::(anonymous_namespace)::Repairer::TableInfo,_std::allocator<leveldb::(anonymous_namespace)::Repairer::TableInfo>_>
      ::push_back(&this->tables_,(value_type *)local_78);
    }
    else {
      TableInfo::TableInfo(&local_238,(TableInfo *)local_78);
      RepairTable(this,(string *)local_98,&local_238);
      TableInfo::~TableInfo(&local_238);
    }
  }
  else {
    TableFileName(local_100,&this->dbname_,t.max_sequence);
    ArchiveFile(this,(string *)local_100);
    std::__cxx11::string::~string((string *)local_100);
    SSTTableFileName(local_120,&this->dbname_,t.max_sequence);
    ArchiveFile(this,(string *)local_120);
    std::__cxx11::string::~string((string *)local_120);
    uVar2 = t.meta._0_8_;
    pLVar1 = (this->options_).info_log;
    Status::ToString_abi_cxx11_((Status *)&counter);
    uVar7 = std::__cxx11::string::c_str();
    Log(pLVar1,"Table #%llu: dropped: %s",uVar2,uVar7);
    std::__cxx11::string::~string((string *)&counter);
  }
  Status::~Status(&local_b0);
  std::__cxx11::string::~string((string *)local_98);
  TableInfo::~TableInfo((TableInfo *)local_78);
  return;
}

Assistant:

void ScanTable(uint64_t number) {
    TableInfo t;
    t.meta.number = number;
    std::string fname = TableFileName(dbname_, number);
    Status status = env_->GetFileSize(fname, &t.meta.file_size);
    if (!status.ok()) {
      // Try alternate file name.
      fname = SSTTableFileName(dbname_, number);
      Status s2 = env_->GetFileSize(fname, &t.meta.file_size);
      if (s2.ok()) {
        status = Status::OK();
      }
    }
    if (!status.ok()) {
      ArchiveFile(TableFileName(dbname_, number));
      ArchiveFile(SSTTableFileName(dbname_, number));
      Log(options_.info_log, "Table #%llu: dropped: %s",
          (unsigned long long)t.meta.number, status.ToString().c_str());
      return;
    }

    // Extract metadata by scanning through table.
    int counter = 0;
    Iterator* iter = NewTableIterator(t.meta);
    bool empty = true;
    ParsedInternalKey parsed;
    t.max_sequence = 0;
    for (iter->SeekToFirst(); iter->Valid(); iter->Next()) {
      Slice key = iter->key();
      if (!ParseInternalKey(key, &parsed)) {
        Log(options_.info_log, "Table #%llu: unparsable key %s",
            (unsigned long long)t.meta.number, EscapeString(key).c_str());
        continue;
      }

      counter++;
      if (empty) {
        empty = false;
        t.meta.smallest.DecodeFrom(key);
      }
      t.meta.largest.DecodeFrom(key);
      if (parsed.sequence > t.max_sequence) {
        t.max_sequence = parsed.sequence;
      }
    }
    if (!iter->status().ok()) {
      status = iter->status();
    }
    delete iter;
    Log(options_.info_log, "Table #%llu: %d entries %s",
        (unsigned long long)t.meta.number, counter, status.ToString().c_str());

    if (status.ok()) {
      tables_.push_back(t);
    } else {
      RepairTable(fname, t);  // RepairTable archives input file.
    }
  }